

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool __thiscall
S2BooleanOperation::Impl::IsFullPolygonUnion(Impl *this,S2ShapeIndex *a,S2ShapeIndex *b)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  bVar1 = GetFaceMask(a);
  bVar2 = GetFaceMask(b);
  if ((bVar2 | bVar1) == 0x3f) {
    dVar4 = S2::GetArea(a);
    dVar5 = S2::GetArea(b);
    dVar6 = dVar5;
    if (dVar5 <= dVar4) {
      dVar6 = dVar4;
    }
    dVar4 = dVar4 + dVar5;
    if (12.566370614359172 <= dVar4) {
      dVar4 = 12.566370614359172;
    }
    bVar3 = 12.566370614359172 - dVar4 < dVar6;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool S2BooleanOperation::Impl::IsFullPolygonUnion(
    const S2ShapeIndex& a, const S2ShapeIndex& b) const {
  // See comments in IsFullPolygonResult().  The most common case is that
  // neither input polygon is empty but the result is empty due to snapping.

  // The result can be full only if the union of the two input geometries
  // intersects all six faces of the S2 cube.  This test is fast.
  if ((GetFaceMask(a) | GetFaceMask(b)) != kAllFacesMask) return false;

  // The union area satisfies:
  //
  //   max(A, B) <= Union(A, B) <= min(4*Pi, A + B)
  //
  // where A, B can refer to a polygon or its area.  We then choose the result
  // that assumes the smallest amount of error.
  double a_area = S2::GetArea(a), b_area = S2::GetArea(b);
  double min_area = max(a_area, b_area);
  double max_area = min(4 * M_PI, a_area + b_area);
  return min_area > 4 * M_PI - max_area;
}